

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::load_memory_space(void)

{
  value_type pSVar1;
  size_type sVar2;
  reference ppSVar3;
  Section *section;
  uint i;
  
  for (section._4_4_ = 0;
      sVar2 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table),
      section._4_4_ < sVar2; section._4_4_ = section._4_4_ + 1) {
    ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,
                         (ulong)section._4_4_);
    pSVar1 = *ppSVar3;
    if ((pSVar1->flags & 1) != 0) {
      Memory_space::write((Memory_space *)memory,pSVar1->base_address,pSVar1->content,
                          (ulong)pSVar1->content_size);
    }
  }
  return;
}

Assistant:

void Sections::load_memory_space()
{
	for (auto i = 0U; i < Sections::table.size(); ++i) {
		Section *section = Sections::table.at(i);
		if ((section->flags & Section::LOADABLE) == 0)
			continue;
		memory.write(section->base_address, section->content, section->content_size);
	}
}